

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtUtil.c
# Opt level: O3

char * Rwt_ManGetPractical(Rwt_Man_t *p)

{
  char *pcVar1;
  long lVar2;
  
  lVar2 = 1;
  pcVar1 = (char *)calloc(1,(long)p->nFuncs);
  *pcVar1 = '\x01';
  do {
    pcVar1[s_RwtPracticalClasses[lVar2]] = '\x01';
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x87);
  return pcVar1;
}

Assistant:

char * Rwt_ManGetPractical( Rwt_Man_t * p )
{
    char * pPractical;
    int i;
    pPractical = ABC_ALLOC( char, p->nFuncs );
    memset( pPractical, 0, sizeof(char) * p->nFuncs );
    pPractical[0] = 1;
    for ( i = 1; ; i++ )
    {
        if ( s_RwtPracticalClasses[i] == 0 )
            break;
        pPractical[ s_RwtPracticalClasses[i] ] = 1;
    }
    return pPractical;
}